

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_decomp(gz_statep state)

{
  uInt uVar1;
  int iVar2;
  bool local_39;
  char *local_38;
  z_streamp strm;
  uint had;
  int ret;
  gz_statep state_local;
  
  strm._4_4_ = 0;
  uVar1 = (state->strm).avail_out;
  do {
    if (((state->strm).avail_in == 0) && (iVar2 = gz_avail(state), iVar2 == -1)) {
      return -1;
    }
    if ((state->strm).avail_in == 0) {
      gz_error(state,-5,"unexpected end of file");
      break;
    }
    strm._4_4_ = inflate(&state->strm,0);
    if ((strm._4_4_ == -2) || (strm._4_4_ == 2)) {
      gz_error(state,-2,"internal error: inflate stream corrupt");
      return -1;
    }
    if (strm._4_4_ == -4) {
      gz_error(state,-4,"out of memory");
      return -1;
    }
    if (strm._4_4_ == -3) {
      if ((state->strm).msg == (char *)0x0) {
        local_38 = "compressed data error";
      }
      else {
        local_38 = (state->strm).msg;
      }
      gz_error(state,-3,local_38);
      return -1;
    }
    local_39 = (state->strm).avail_out != 0 && strm._4_4_ != 1;
  } while (local_39);
  (state->x).have = uVar1 - (state->strm).avail_out;
  (state->x).next = (state->strm).next_out + -(ulong)(state->x).have;
  if (strm._4_4_ == 1) {
    state->how = 0;
  }
  return 0;
}

Assistant:

local int gz_decomp(state)
    gz_statep state;
{
    int ret = Z_OK;
    unsigned had;
    z_streamp strm = &(state->strm);

    /* fill output buffer up to end of deflate stream */
    had = strm->avail_out;
    do {
        /* get more input for inflate() */
        if (strm->avail_in == 0 && gz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0) {
            gz_error(state, Z_BUF_ERROR, "unexpected end of file");
            break;
        }

        /* decompress and handle errors */
        ret = inflate(strm, Z_NO_FLUSH);
        if (ret == Z_STREAM_ERROR || ret == Z_NEED_DICT) {
            gz_error(state, Z_STREAM_ERROR,
                     "internal error: inflate stream corrupt");
            return -1;
        }
        if (ret == Z_MEM_ERROR) {
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        if (ret == Z_DATA_ERROR) {              /* deflate stream invalid */
            gz_error(state, Z_DATA_ERROR,
                     strm->msg == NULL ? "compressed data error" : strm->msg);
            return -1;
        }
    } while (strm->avail_out && ret != Z_STREAM_END);

    /* update available output */
    state->x.have = had - strm->avail_out;
    state->x.next = strm->next_out - state->x.have;

    /* if the gzip stream completed successfully, look for another */
    if (ret == Z_STREAM_END)
        state->how = LOOK;

    /* good decompression */
    return 0;
}